

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall
CDirectivePosition::CDirectivePosition(CDirectivePosition *this,Expression *expression,Type type)

{
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectivePosition_001b9068;
  Expression::Expression(&this->expression,expression);
  this->type = type;
  Global.Section = Global.Section + 1;
  (this->super_CAssemblerCommand).section = Global.Section;
  return;
}

Assistant:

CDirectivePosition::CDirectivePosition(Expression expression, Type type)
	: expression(expression), type(type)
{
	updateSection(++Global.Section);
}